

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::QueuedPipeline::getPipelinedCap(QueuedPipeline *this,ArrayPtr<const_capnp::PipelineOp> ops)

{
  void *firstElement;
  size_t in_RCX;
  ClientHook *extraout_RDX;
  long lVar2;
  void *pvVar3;
  size_t elementCount;
  Own<capnp::ClientHook,_std::nullptr_t> OVar4;
  Array<capnp::PipelineOp> result;
  ClientHook *pCVar1;
  
  firstElement = kj::_::HeapArrayDisposer::allocateImpl
                           (8,0,in_RCX,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pvVar3 = firstElement;
  if (in_RCX != 0) {
    lVar2 = 0;
    do {
      *(undefined8 *)((long)firstElement + lVar2) = *(undefined8 *)(ops.size_ + lVar2);
      lVar2 = lVar2 + 8;
    } while (in_RCX << 3 != lVar2);
    pvVar3 = (void *)(lVar2 + (long)firstElement);
  }
  elementCount = (long)pvVar3 - (long)firstElement >> 3;
  OVar4 = getPipelinedCap(this,(Array<capnp::PipelineOp> *)ops.ptr);
  pCVar1 = OVar4.ptr;
  if (firstElement != (void *)0x0) {
    kj::_::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,firstElement,8,elementCount,
               elementCount,(_func_void_void_ptr *)0x0);
    pCVar1 = extraout_RDX;
  }
  OVar4.ptr = pCVar1;
  OVar4.disposer = (Disposer *)this;
  return OVar4;
}

Assistant:

kj::Own<ClientHook> getPipelinedCap(kj::ArrayPtr<const PipelineOp> ops) override {
    auto copy = kj::heapArrayBuilder<PipelineOp>(ops.size());
    for (auto& op: ops) {
      copy.add(op);
    }
    return getPipelinedCap(copy.finish());
  }